

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O1

void __thiscall Socket::Socket(Socket *this,addrinfo *host,int type)

{
  uint uVar1;
  int iVar2;
  sockaddr *psVar3;
  system_error *this_00;
  int *piVar4;
  error_category *__ecat;
  bool bVar5;
  stringstream stream;
  string local_1e0;
  sockaddr_storage *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this->m_WSAInitialized = 1;
  local_1c0 = &this->m_SockAddress;
  psVar3 = (sockaddr *)0x0;
  if (type == 2) {
    psVar3 = (sockaddr *)local_1c0;
  }
  this->m_DestAddr = psVar3;
  this->m_DestAddrLen = 0;
  bVar5 = host == (addrinfo *)0x0;
  if (!bVar5) {
    do {
      iVar2 = socket(host->ai_family,type,0);
      this->m_Socket = iVar2;
      if (iVar2 != -1) {
        if (type == 1) {
          iVar2 = connect(iVar2,(sockaddr *)host->ai_addr,host->ai_addrlen);
          if (iVar2 != 0) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"Socket(): connect failed",0x18);
            std::__cxx11::stringbuf::str();
            Logger::Log(2,&local_1e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p);
            }
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
            close(this->m_Socket);
            this->m_Socket = -1;
            goto LAB_00122f4a;
          }
        }
        else {
          this->m_DestAddrLen = host->ai_addrlen;
        }
        uVar1 = 0x80;
        if (host->ai_addrlen < 0x80) {
          uVar1 = host->ai_addrlen;
        }
        memcpy(local_1c0,host->ai_addr,(ulong)uVar1);
        if (!bVar5) {
          return;
        }
        break;
      }
LAB_00122f4a:
      host = host->ai_next;
      bVar5 = host == (addrinfo *)0x0;
    } while (!bVar5);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unable to create socket",0x17);
  std::__cxx11::stringbuf::str();
  Logger::Log(3,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,iVar2,__ecat);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

Socket::Socket(const struct addrinfo* const host, const int type)
    : m_WSAInitialized(!InitSocketLibrary()),
    m_DestAddr(SOCK_DGRAM == type ? reinterpret_cast<const struct sockaddr*>(&m_SockAddress) : nullptr),
    m_DestAddrLen(0)
{
    for (auto rp = host; rp; rp = rp->ai_next) {
        m_Socket = socket(rp->ai_family, type, 0);
        if (INVALID_SOCKET == m_Socket) {
            continue;
        }
        if (SOCK_STREAM == type) {
            if (::connect(m_Socket, rp->ai_addr, rp->ai_addrlen)) {
                LOG_WARN("Socket(): connect failed");
                closesocket(m_Socket);
                m_Socket = INVALID_SOCKET;
                continue;
            }
        } else { /*if (SOCK_DGRAM == type)*/
#if defined(_WIN32) || defined(__CYGWIN__)
            // MSVC on Windows is the only platform using different types for connect() and ai_addrlen ...
            m_DestAddrLen = static_cast<decltype(m_DestAddrLen)>(rp->ai_addrlen);
#else
            m_DestAddrLen = rp->ai_addrlen;
#endif
        }
        memcpy(&m_SockAddress, rp->ai_addr, std::min<size_t>(sizeof(m_SockAddress), rp->ai_addrlen));
        return;
    }
    LOG_ERROR("Unable to create socket");
    throw std::system_error(WSAGetLastError(), std::system_category());
}